

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

CURLcode mqtt_subscribe(Curl_easy *data)

{
  bool bVar1;
  CURLcode CVar2;
  void *pvVar3;
  ulong uVar4;
  char *buf;
  ulong uVar5;
  ulong uVar6;
  size_t __n;
  size_t len;
  size_t topiclen;
  char *topic;
  char encodedsize [4];
  char local_48;
  char cStack_47;
  undefined6 uStack_46;
  char *local_40;
  byte local_34 [4];
  
  local_40 = (char *)0x0;
  pvVar3 = Curl_conn_meta_get(data->conn,"meta:proto:mqtt:conn");
  if (pvVar3 == (void *)0x0) {
    return CURLE_FAILED_INIT;
  }
  CVar2 = mqtt_get_topic(data,&local_40,(size_t *)&local_48);
  if (CVar2 == CURLE_OK) {
    *(int *)((long)pvVar3 + 8) = *(int *)((long)pvVar3 + 8) + 1;
    __n = 0;
    uVar4 = CONCAT62(uStack_46,CONCAT11(cStack_47,local_48)) + 5;
    uVar5 = uVar4;
    uVar6 = __n;
    if (uVar4 != 0) {
      do {
        local_34[uVar6] = (0x7f < uVar5) << 7 | (byte)uVar5 & 0x7f;
        __n = uVar6 + 1;
        if (2 < uVar6) break;
        bVar1 = 0x7f < uVar5;
        uVar5 = uVar5 >> 7;
        uVar6 = __n;
      } while (bVar1);
    }
    len = __n + uVar4 + 1;
    buf = (char *)(*Curl_cmalloc)(len);
    if (buf != (char *)0x0) {
      *buf = -0x7e;
      memcpy(buf + 1,local_34,__n);
      buf[__n + 1] = *(char *)((long)pvVar3 + 9);
      buf[__n + 2] = *(char *)((long)pvVar3 + 8);
      buf[__n + 3] = cStack_47;
      buf[__n + 4] = local_48;
      memcpy(buf + __n + 5,local_40,CONCAT62(uStack_46,CONCAT11(cStack_47,local_48)));
      buf[CONCAT62(uStack_46,CONCAT11(cStack_47,local_48)) + 5 + __n] = '\0';
      CVar2 = mqtt_send(data,buf,len);
      goto LAB_001454dc;
    }
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  buf = (char *)0x0;
LAB_001454dc:
  (*Curl_cfree)(local_40);
  (*Curl_cfree)(buf);
  return CVar2;
}

Assistant:

static CURLcode mqtt_subscribe(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  char *topic = NULL;
  size_t topiclen;
  unsigned char *packet = NULL;
  size_t packetlen;
  char encodedsize[4];
  size_t n;
  struct connectdata *conn = data->conn;
  struct mqtt_conn *mqtt = Curl_conn_meta_get(conn, CURL_META_MQTT_CONN);

  if(!mqtt)
    return CURLE_FAILED_INIT;

  result = mqtt_get_topic(data, &topic, &topiclen);
  if(result)
    goto fail;

  mqtt->packetid++;

  packetlen = topiclen + 5; /* packetid + topic (has a two byte length field)
                               + 2 bytes topic length + QoS byte */
  n = mqtt_encode_len((char *)encodedsize, packetlen);
  packetlen += n + 1; /* add one for the control packet type byte */

  packet = malloc(packetlen);
  if(!packet) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  packet[0] = MQTT_MSG_SUBSCRIBE;
  memcpy(&packet[1], encodedsize, n);
  packet[1 + n] = (mqtt->packetid >> 8) & 0xff;
  packet[2 + n] = mqtt->packetid & 0xff;
  packet[3 + n] = (topiclen >> 8) & 0xff;
  packet[4 + n ] = topiclen & 0xff;
  memcpy(&packet[5 + n], topic, topiclen);
  packet[5 + n + topiclen] = 0; /* QoS zero */

  result = mqtt_send(data, (const char *)packet, packetlen);

fail:
  free(topic);
  free(packet);
  return result;
}